

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   int depth_limit,int token_limit)

{
  span<const_char> buffer_00;
  error_code ec;
  
  buffer_00.m_ptr = buffer.m_ptr;
  buffer_00.m_len = (difference_type)&stack0xffffffffffffffd0;
  bdecode(__return_storage_ptr__,this,buffer_00,(error_code *)0x0,(int *)(ulong)(uint)buffer.m_len,
          depth_limit,0);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode(span<char const> buffer, int depth_limit, int token_limit)
	{
		error_code ec;
		bdecode_node ret = bdecode(buffer, ec, nullptr, depth_limit, token_limit);
		if (ec) throw system_error(ec);
		return ret;
	}